

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O1

Hop_Obj_t * Amap_ParseFormulaOper(Hop_Man_t *pMan,Vec_Ptr_t *pStackFn,int Oper)

{
  uint uVar1;
  Hop_Obj_t *p0;
  Hop_Obj_t *pHVar2;
  void **ppvVar3;
  int iVar4;
  
  iVar4 = pStackFn->nSize;
  if (0 < iVar4) {
    pStackFn->nSize = iVar4 - 1U;
    if (iVar4 != 1) {
      pHVar2 = (Hop_Obj_t *)pStackFn->pArray[iVar4 - 1U];
      pStackFn->nSize = iVar4 - 2U;
      p0 = (Hop_Obj_t *)pStackFn->pArray[iVar4 - 2U];
      if (Oper == 7) {
        pHVar2 = Hop_Or(pMan,p0,pHVar2);
      }
      else if (Oper == 8) {
        pHVar2 = Hop_Exor(pMan,p0,pHVar2);
      }
      else {
        if (Oper != 9) {
          return (Hop_Obj_t *)0x0;
        }
        pHVar2 = Hop_And(pMan,p0,pHVar2);
      }
      uVar1 = pStackFn->nCap;
      if (pStackFn->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pStackFn->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pStackFn->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_003b3608;
          if (pStackFn->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pStackFn->pArray,(ulong)uVar1 << 4);
          }
        }
        pStackFn->pArray = ppvVar3;
        pStackFn->nCap = iVar4;
      }
LAB_003b3608:
      iVar4 = pStackFn->nSize;
      pStackFn->nSize = iVar4 + 1;
      pStackFn->pArray[iVar4] = pHVar2;
      return pHVar2;
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Amap_ParseFormulaOper( Hop_Man_t * pMan, Vec_Ptr_t * pStackFn, int Oper )
{
    Hop_Obj_t * gArg1, * gArg2, * gFunc;
    // perform the given operation
    gArg2 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
    gArg1 = (Hop_Obj_t *)Vec_PtrPop( pStackFn );
	if ( Oper == AMAP_EQN_OPER_AND )
		gFunc = Hop_And( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_OR )
		gFunc = Hop_Or( pMan, gArg1, gArg2 );
	else if ( Oper == AMAP_EQN_OPER_XOR )
		gFunc = Hop_Exor( pMan, gArg1, gArg2 );
	else
		return NULL;
//    Cudd_Ref( gFunc );
//    Cudd_RecursiveDeref( dd, gArg1 );
//    Cudd_RecursiveDeref( dd, gArg2 );
	Vec_PtrPush( pStackFn,  gFunc );
    return gFunc;
}